

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Single_Quoted_String
          (ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this)

{
  char_type *pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  char_type *pcVar4;
  eval_error *this_00;
  char_type *pcVar5;
  char_type *pcVar6;
  string_view t_match;
  Depth_Counter dc;
  string match;
  Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cparser;
  char local_c9;
  File_Position local_c8;
  uint local_c0;
  int local_bc;
  Depth_Counter local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Depth_Counter::Depth_Counter(&local_b8,this);
  SkipWS(this,false);
  local_bc = (this->m_position).line;
  local_c0 = (this->m_position).col;
  pcVar5 = (this->m_position).m_pos;
  pcVar1 = (this->m_position).m_end;
  bVar3 = Single_Quoted_String_(this);
  if (bVar3) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_90._0_8_ = &local_b0;
    local_80.field_2._M_allocated_capacity = (size_type)&local_60;
    local_80._M_dataplus._M_p = (pointer)0x0;
    local_90._12_4_ = local_90._12_4_ & 0xffffff00;
    local_90[8] = false;
    local_90[9] = false;
    local_90[10] = false;
    local_90[0xb] = false;
    local_80._M_string_length._0_1_ = false;
    local_80.field_2._8_8_ = 0;
    local_60._M_local_buf[0] = '\0';
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    pcVar5 = pcVar5 + (pcVar5 != pcVar1);
    pcVar6 = (this->m_position).m_pos + -1;
    if (pcVar5 != pcVar6) {
      do {
        pcVar4 = "";
        if (pcVar5 != pcVar1) {
          pcVar4 = pcVar5;
        }
        Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::parse((Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_90,*pcVar4,local_bc,local_c0,
                (this->m_filename).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr);
        pcVar5 = pcVar5 + (pcVar5 != pcVar1);
      } while (pcVar5 != pcVar6);
    }
    Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Char_Parser((Char_Parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_90);
    _Var2._M_p = local_b0._M_dataplus._M_p;
    if (local_b0._M_string_length != 1) {
      this_00 = (eval_error *)__cxa_allocate_exception(0x90);
      local_90._0_8_ = &local_80;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_90,"Single-quoted strings must be 1 character long","");
      local_c8.line = (this->m_position).line;
      local_c8.column = (this->m_position).col;
      exception::eval_error::eval_error
                (this_00,(string *)local_90,&local_c8,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    local_c9 = *local_b0._M_dataplus._M_p;
    detail::const_var_impl<char>((detail *)local_90,&local_c9);
    t_match._M_str = (char *)0x1;
    t_match._M_len = (size_t)this;
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::
    make_node<chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>,chaiscript::Boxed_Value>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)&local_c8,t_match,(int)_Var2._M_p,local_bc,(Boxed_Value *)(ulong)local_c0);
    std::
    vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>>>
    ::
    emplace_back<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>>
              ((vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>,std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>>>>>>
                *)&this->m_match_stack,
               (unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>
                *)&local_c8);
    if (local_c8 != (File_Position)0x0) {
      (**(code **)(*(long *)local_c8 + 0x18))();
    }
    local_c8.line = 0;
    local_c8.column = 0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(local_90._12_4_,local_90._8_4_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_90._12_4_,local_90._8_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  }
  (local_b8.parser)->m_current_parse_depth = (local_b8.parser)->m_current_parse_depth - 1;
  return bVar3;
}

Assistant:

bool Single_Quoted_String() {
        Depth_Counter dc{this};
        SkipWS();

        const auto start = m_position;
        if (Single_Quoted_String_()) {
          std::string match;

          {
            // scope for cparser destructor
            Char_Parser<std::string> cparser(match, false);

            for (auto s = start + 1, end = m_position - 1; s != end; ++s) {
              cparser.parse(*s, start.line, start.col, *m_filename);
            }
          }

          if (match.size() != 1) {
            throw exception::eval_error("Single-quoted strings must be 1 character long",
                                        File_Position(m_position.line, m_position.col),
                                        *m_filename);
          }

          m_match_stack.push_back(make_node<eval::Constant_AST_Node<Tracer>>(match, start.line, start.col, const_var(char(match.at(0)))));
          return true;
        } else {
          return false;
        }
      }